

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O1

void fill_MPP_FMT_RGB555(RK_U8 *p,RK_U32 R,RK_U32 G,RK_U32 B,RK_U32 be)

{
  int iVar1;
  byte bVar2;
  byte bVar3;
  
  iVar1 = (R & 0xf8) * 0x80 + (G & 0xf8) * 4;
  bVar2 = (byte)(B >> 3) & 0x1f | (byte)iVar1;
  bVar3 = (byte)((uint)iVar1 >> 8);
  if (be == 0) {
    *p = bVar2;
  }
  else {
    *p = bVar3;
    bVar3 = bVar2;
  }
  p[1] = bVar3;
  return;
}

Assistant:

static void fill_MPP_FMT_RGB555(RK_U8 *p, RK_U32 R, RK_U32 G, RK_U32 B, RK_U32 be)
{
    // MPP_FMT_RGB555 = ffmpeg: rgb555be
    // 16 bit pixel     MSB  -------->  LSB
    //                 (0rrr,rrgg,gggb,bbbb)
    // big    endian   |  byte 0 |  byte 1 |
    // little endian   |  byte 1 |  byte 0 |
    RK_U16 val = (((R >> 3) & 0x1f) << 10) |
                 (((G >> 3) & 0x1f) <<  5) |
                 (((B >> 3) & 0x1f) <<  0);
    if (be) {
        p[0] = (val >> 8) & 0xff;
        p[1] = (val >> 0) & 0xff;
    } else {
        p[0] = (val >> 0) & 0xff;
        p[1] = (val >> 8) & 0xff;
    }
}